

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32
drwav__read_fmt(drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,
               drwav_container container,drwav_uint64 *pRunningBytesReadOut,drwav_fmt *fmtOut)

{
  drwav_uint16 *pdVar1;
  drwav_result dVar2;
  drwav_bool32 dVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  drwav_uint8 fmt_cbSize [2];
  drwav_chunk_header header;
  drwav_uint8 fmt [16];
  drwav_uint8 fmtext [22];
  ushort local_8a;
  drwav_uint64 *local_88;
  drwav_fmt *local_80;
  drwav_chunk_header local_78;
  undefined4 local_58;
  undefined8 local_54;
  undefined4 local_4c;
  drwav_uint16 local_48;
  drwav_uint32 local_46;
  undefined8 local_42;
  undefined8 uStack_3a;
  
  dVar2 = drwav__read_chunk_header(onRead,pUserData,container,pRunningBytesReadOut,&local_78);
  local_88 = pRunningBytesReadOut;
  local_80 = fmtOut;
  if (dVar2 != 0) {
    return 0;
  }
  do {
    if (((container & ~drwav_container_rf64) != drwav_container_riff) ||
       ((int)local_78.id._0_8_ == 0x20746d66)) {
      if (container != drwav_container_w64) {
LAB_001221dd:
        if ((container & ~drwav_container_rf64) == drwav_container_riff) {
          if ((int)local_78.id._0_8_ != 0x20746d66) {
            return 0;
          }
        }
        else {
          lVar4 = 0;
          do {
            if (local_78.id.fourcc[lVar4] != drwavGUID_W64_FMT[lVar4]) {
              return 0;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x10);
        }
        sVar5 = (*onRead)(pUserData,&local_58,0x10);
        dVar3 = 0;
        if (sVar5 == 0x10) {
          *local_88 = *local_88 + 0x10;
          local_80->formatTag = (undefined2)local_58;
          local_80->channels = local_58._2_2_;
          local_80->sampleRate = (undefined4)local_54;
          local_80->avgBytesPerSec = local_54._4_4_;
          local_80->blockAlign = (undefined2)local_4c;
          local_80->bitsPerSample = local_4c._2_2_;
          local_80->extendedSize = 0;
          local_80->validBitsPerSample = 0;
          local_80->channelMask = 0;
          local_80->subFormat[0] = '\0';
          local_80->subFormat[1] = '\0';
          local_80->subFormat[2] = '\0';
          local_80->subFormat[3] = '\0';
          local_80->subFormat[4] = '\0';
          local_80->subFormat[5] = '\0';
          local_80->subFormat[6] = '\0';
          local_80->subFormat[7] = '\0';
          local_80->subFormat[8] = '\0';
          local_80->subFormat[9] = '\0';
          local_80->subFormat[10] = '\0';
          local_80->subFormat[0xb] = '\0';
          local_80->subFormat[0xc] = '\0';
          local_80->subFormat[0xd] = '\0';
          local_80->subFormat[0xe] = '\0';
          local_80->subFormat[0xf] = '\0';
          if (0x10 < CONCAT44(local_78.sizeInBytes._4_4_,(int)local_78.sizeInBytes)) {
            sVar5 = (*onRead)(pUserData,&local_8a,2);
            if (sVar5 != 2) {
              return 0;
            }
            *local_88 = *local_88 + 2;
            pdVar1 = &local_80->extendedSize;
            *pdVar1 = local_8a;
            if ((ulong)local_8a == 0) {
              lVar4 = 0x12;
            }
            else {
              if (local_8a != 0x16 && local_80->formatTag == 0xfffe) {
                return 0;
              }
              if (local_80->formatTag == 0xfffe) {
                sVar5 = (*onRead)(pUserData,&local_48,(ulong)local_8a);
                uVar6 = (ulong)*pdVar1;
                if (sVar5 != uVar6) {
                  return 0;
                }
                local_80->validBitsPerSample = local_48;
                local_80->channelMask = local_46;
                *(undefined8 *)local_80->subFormat = local_42;
                *(undefined8 *)(local_80->subFormat + 8) = uStack_3a;
              }
              else {
                dVar3 = (*onSeek)(pUserData,(uint)local_8a,drwav_seek_origin_current);
                if (dVar3 == 0) {
                  return 0;
                }
                uVar6 = (ulong)*pdVar1;
              }
              *local_88 = *local_88 + uVar6;
              lVar4 = uVar6 + 0x12;
            }
            dVar3 = (*onSeek)(pUserData,(int)local_78.sizeInBytes - (int)lVar4,
                              drwav_seek_origin_current);
            if (dVar3 == 0) {
              return 0;
            }
            *local_88 = *local_88 +
                        (CONCAT44(local_78.sizeInBytes._4_4_,(int)local_78.sizeInBytes) - lVar4);
          }
          if (local_78.paddingSize != 0) {
            dVar3 = (*onSeek)(pUserData,local_78.paddingSize,drwav_seek_origin_current);
            if (dVar3 == 0) {
              return 0;
            }
            *local_88 = *local_88 + (ulong)local_78.paddingSize;
          }
          dVar3 = 1;
        }
        return dVar3;
      }
      lVar4 = 0;
      while (local_78.id.fourcc[lVar4] == drwavGUID_W64_FMT[lVar4]) {
        lVar4 = lVar4 + 1;
        if (lVar4 == 0x10) goto LAB_001221dd;
      }
    }
    uVar6 = (ulong)local_78.paddingSize +
            CONCAT44(local_78.sizeInBytes._4_4_,(int)local_78.sizeInBytes);
    if (uVar6 == 0) {
      lVar4 = 0;
    }
    else {
      if (uVar6 >> 0x1f != 0) {
        do {
          dVar3 = (*onSeek)(pUserData,0x7fffffff,drwav_seek_origin_current);
          if (dVar3 == 0) {
            return 0;
          }
          uVar6 = uVar6 - 0x7fffffff;
        } while (0x7fffffff < uVar6);
      }
      dVar3 = (*onSeek)(pUserData,(int)uVar6,drwav_seek_origin_current);
      if (dVar3 == 0) {
        return 0;
      }
      lVar4 = (ulong)local_78.paddingSize +
              CONCAT44(local_78.sizeInBytes._4_4_,(int)local_78.sizeInBytes);
    }
    *local_88 = *local_88 + lVar4;
    dVar2 = drwav__read_chunk_header(onRead,pUserData,container,local_88,&local_78);
    if (dVar2 != 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static drwav_bool32 drwav__read_fmt(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_fmt* fmtOut)
{
    drwav_chunk_header header;
    drwav_uint8 fmt[16];

    if (drwav__read_chunk_header(onRead, pUserData, container, pRunningBytesReadOut, &header) != DRWAV_SUCCESS) {
        return DRWAV_FALSE;
    }


    /* Skip non-fmt chunks. */
    while (((container == drwav_container_riff || container == drwav_container_rf64) && !drwav__fourcc_equal(header.id.fourcc, "fmt ")) || (container == drwav_container_w64 && !drwav__guid_equal(header.id.guid, drwavGUID_W64_FMT))) {
        if (!drwav__seek_forward(onSeek, header.sizeInBytes + header.paddingSize, pUserData)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += header.sizeInBytes + header.paddingSize;

        /* Try the next header. */
        if (drwav__read_chunk_header(onRead, pUserData, container, pRunningBytesReadOut, &header) != DRWAV_SUCCESS) {
            return DRWAV_FALSE;
        }
    }


    /* Validation. */
    if (container == drwav_container_riff || container == drwav_container_rf64) {
        if (!drwav__fourcc_equal(header.id.fourcc, "fmt ")) {
            return DRWAV_FALSE;
        }
    } else {
        if (!drwav__guid_equal(header.id.guid, drwavGUID_W64_FMT)) {
            return DRWAV_FALSE;
        }
    }


    if (onRead(pUserData, fmt, sizeof(fmt)) != sizeof(fmt)) {
        return DRWAV_FALSE;
    }
    *pRunningBytesReadOut += sizeof(fmt);

    fmtOut->formatTag      = drwav__bytes_to_u16(fmt + 0);
    fmtOut->channels       = drwav__bytes_to_u16(fmt + 2);
    fmtOut->sampleRate     = drwav__bytes_to_u32(fmt + 4);
    fmtOut->avgBytesPerSec = drwav__bytes_to_u32(fmt + 8);
    fmtOut->blockAlign     = drwav__bytes_to_u16(fmt + 12);
    fmtOut->bitsPerSample  = drwav__bytes_to_u16(fmt + 14);

    fmtOut->extendedSize       = 0;
    fmtOut->validBitsPerSample = 0;
    fmtOut->channelMask        = 0;
    memset(fmtOut->subFormat, 0, sizeof(fmtOut->subFormat));

    if (header.sizeInBytes > 16) {
        drwav_uint8 fmt_cbSize[2];
        int bytesReadSoFar = 0;

        if (onRead(pUserData, fmt_cbSize, sizeof(fmt_cbSize)) != sizeof(fmt_cbSize)) {
            return DRWAV_FALSE;    /* Expecting more data. */
        }
        *pRunningBytesReadOut += sizeof(fmt_cbSize);

        bytesReadSoFar = 18;

        fmtOut->extendedSize = drwav__bytes_to_u16(fmt_cbSize);
        if (fmtOut->extendedSize > 0) {
            /* Simple validation. */
            if (fmtOut->formatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
                if (fmtOut->extendedSize != 22) {
                    return DRWAV_FALSE;
                }
            }

            if (fmtOut->formatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
                drwav_uint8 fmtext[22];
                if (onRead(pUserData, fmtext, fmtOut->extendedSize) != fmtOut->extendedSize) {
                    return DRWAV_FALSE;    /* Expecting more data. */
                }

                fmtOut->validBitsPerSample = drwav__bytes_to_u16(fmtext + 0);
                fmtOut->channelMask        = drwav__bytes_to_u32(fmtext + 2);
                drwav__bytes_to_guid(fmtext + 6, fmtOut->subFormat);
            } else {
                if (!onSeek(pUserData, fmtOut->extendedSize, drwav_seek_origin_current)) {
                    return DRWAV_FALSE;
                }
            }
            *pRunningBytesReadOut += fmtOut->extendedSize;

            bytesReadSoFar += fmtOut->extendedSize;
        }

        /* Seek past any leftover bytes. For w64 the leftover will be defined based on the chunk size. */
        if (!onSeek(pUserData, (int)(header.sizeInBytes - bytesReadSoFar), drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += (header.sizeInBytes - bytesReadSoFar);
    }

    if (header.paddingSize > 0) {
        if (!onSeek(pUserData, header.paddingSize, drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += header.paddingSize;
    }

    return DRWAV_TRUE;
}